

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

double __thiscall
QCborValueConstRef::concreteDouble
          (QCborValueConstRef *this,QCborValueConstRef self,double defaultValue)

{
  int iVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = *(double *)(&(this[3].d)->super_QSharedData + (long)self.d * 4);
  iVar1 = (int)(&(this[3].d)->usedData)[(long)self.d * 2];
  dVar3 = dVar2;
  if ((iVar1 != 0x202) && (dVar3 = defaultValue, iVar1 == 0)) {
    return (double)(long)dVar2;
  }
  return dVar3;
}

Assistant:

const T *data() const noexcept { return ptr; }